

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

MessageLite *
google::protobuf::internal::GetOwnedMessageInternal
          (Arena *message_arena,MessageLite *submessage,Arena *submessage_arena)

{
  MessageLite *pMVar1;
  LogMessage *pLVar2;
  Arena *pAVar3;
  MessageLite *ret;
  LogMessage local_110;
  LogFinisher local_d2;
  byte local_d1;
  LogMessage local_d0;
  LogFinisher local_95 [20];
  byte local_81;
  LogMessage local_80;
  MessageLite *local_48;
  Arena *submessage_arena_local;
  MessageLite *submessage_local;
  Arena *message_arena_local;
  Arena *local_28;
  MessageLite *local_20;
  Arena *local_18;
  MessageLite *local_10;
  
  local_48 = (MessageLite *)submessage_arena;
  submessage_arena_local = (Arena *)submessage;
  submessage_local = (MessageLite *)message_arena;
  pMVar1 = (MessageLite *)
           Arena::InternalHelper<google::protobuf::MessageLite>::GetOwningArena(submessage);
  local_81 = 0;
  if (pMVar1 != local_48) {
    LogMessage::LogMessage
              (&local_80,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_util.cc"
               ,0x2fa);
    local_81 = 1;
    pLVar2 = LogMessage::operator<<
                       (&local_80,
                        "CHECK failed: Arena::InternalHelper<MessageLite>::GetOwningArena(submessage) == submessage_arena: "
                       );
    LogFinisher::operator=(local_95,pLVar2);
  }
  if ((local_81 & 1) != 0) {
    LogMessage::~LogMessage(&local_80);
  }
  local_d1 = 0;
  if (submessage_local == local_48) {
    LogMessage::LogMessage
              (&local_d0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_util.cc"
               ,0x2fb);
    local_d1 = 1;
    pLVar2 = LogMessage::operator<<(&local_d0,"CHECK failed: message_arena != submessage_arena: ");
    LogFinisher::operator=(&local_d2,pLVar2);
  }
  if ((local_d1 & 1) != 0) {
    LogMessage::~LogMessage(&local_d0);
  }
  ret._7_1_ = 0;
  if (local_48 != (MessageLite *)0x0) {
    LogMessage::LogMessage
              (&local_110,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_util.cc"
               ,0x2fc);
    ret._7_1_ = 1;
    pLVar2 = LogMessage::operator<<(&local_110,"CHECK failed: (submessage_arena) == (nullptr): ");
    LogFinisher::operator=((LogFinisher *)((long)&ret + 6),pLVar2);
  }
  if ((ret._7_1_ & 1) != 0) {
    LogMessage::~LogMessage(&local_110);
  }
  if ((submessage_local == (MessageLite *)0x0) || (local_48 != (MessageLite *)0x0)) {
    pAVar3 = (Arena *)(**(code **)(*(long *)submessage_arena_local + 0x18))
                                (submessage_arena_local,submessage_local);
    (**(code **)(*(long *)pAVar3 + 0x38))(pAVar3,submessage_arena_local);
    message_arena_local = pAVar3;
  }
  else {
    local_20 = submessage_local;
    local_28 = submessage_arena_local;
    local_10 = submessage_local;
    local_18 = submessage_arena_local;
    if (submessage_arena_local != (Arena *)0x0) {
      ThreadSafeArena::AddCleanup
                ((ThreadSafeArena *)submessage_local,submessage_arena_local,
                 arena_delete_object<google::protobuf::MessageLite>);
    }
    message_arena_local = submessage_arena_local;
  }
  return (MessageLite *)message_arena_local;
}

Assistant:

MessageLite* GetOwnedMessageInternal(Arena* message_arena,
                                     MessageLite* submessage,
                                     Arena* submessage_arena) {
  GOOGLE_DCHECK(Arena::InternalHelper<MessageLite>::GetOwningArena(submessage) ==
         submessage_arena);
  GOOGLE_DCHECK(message_arena != submessage_arena);
  GOOGLE_DCHECK_EQ(submessage_arena, nullptr);
  if (message_arena != nullptr && submessage_arena == nullptr) {
    message_arena->Own(submessage);
    return submessage;
  } else {
    MessageLite* ret = submessage->New(message_arena);
    ret->CheckTypeAndMergeFrom(*submessage);
    return ret;
  }
}